

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glloader.c
# Opt level: O1

ktx_error_code_e
texImage1DCallback(int miplevel,int face,int width,int height,int depth,ktx_uint64_t faceLodSize,
                  void *pixels,void *userdata)

{
  GLenum GVar1;
  
  if (gl.glTexImage1D != (PFNGLTEXIMAGE1DPROC)0x0) {
    (*gl.glTexImage1D)(face + *userdata,miplevel,*(GLint *)((long)userdata + 8),width,0,
                       *(GLenum *)((long)userdata + 4),*(GLenum *)((long)userdata + 0xc),pixels);
    GVar1 = (*gl.glGetError)();
    *(GLenum *)((long)userdata + 0x10) = GVar1;
    return (uint)(GVar1 != 0) * 9;
  }
  __assert_fail("gl.glTexImage1D != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/glloader.c"
                ,0x1d2,
                "ktx_error_code_e texImage1DCallback(int, int, int, int, int, ktx_uint64_t, void *, void *)"
               );
}

Assistant:

KTX_error_code
texImage1DCallback(int miplevel, int face,
                   int width, int height,
                   int depth,
                   ktx_uint64_t faceLodSize,
                   void* pixels, void* userdata)
{
    ktx_cbdata* cbData = (ktx_cbdata*)userdata;
    UNUSED(faceLodSize);
    UNUSED(depth);
    UNUSED(height);

    assert(gl.glTexImage1D != NULL);
    gl.glTexImage1D(cbData->glTarget + face, miplevel,
                   cbData->glInternalformat, width, 0,
                   cbData->glFormat, cbData->glType, pixels);

    if ((cbData->glError = glGetError()) == GL_NO_ERROR) {
        return KTX_SUCCESS;
    } else {
        return KTX_GL_ERROR;
    }
}